

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntelligentKeyboard.cpp
# Opt level: O1

void __thiscall
Atari::ST::IntelligentKeyboard::set_mouse_button_actions(IntelligentKeyboard *this,uint8_t param_1)

{
  LogLine local_10;
  
  local_10.stream_ = (FILE *)_stderr;
  fprintf(_stderr,"[%s] ","IKYB");
  Log::Logger<(Log::Source)14>::LogLine::append(&local_10,"Unimplemented: set mouse button actions")
  ;
  fputc(10,(FILE *)local_10.stream_);
  return;
}

Assistant:

void IntelligentKeyboard::dispatch_command(uint8_t command) {
	// Enqueue for parsing.
	command_sequence_.push_back(command);

	// For each possible command, check that the proper number of bytes are present.
	// If not, exit. If so, perform and drop out of the switch.
	switch(command_sequence_.front()) {
		default:
			logger.error().append("Unrecognised IKBD command %02x", command);
		break;

		case 0x80:
			/*
				Reset: 0x80 0x01.
				"Any byte following an 0x80 command byte other than 0x01 is ignored (and causes the 0x80 to be ignored)."
			*/
			if(command_sequence_.size() != 2) return;
			if(command_sequence_[1] == 0x01) {
				reset();
			}
		break;

		case 0x07:
			if(command_sequence_.size() != 2) return;
			set_mouse_button_actions(command_sequence_[1]);
		break;

		case 0x08:
			set_relative_mouse_position_reporting();
		break;

		case 0x09:
			if(command_sequence_.size() != 5) return;
			set_absolute_mouse_position_reporting(
				uint16_t((command_sequence_[1] << 8) | command_sequence_[2]),
				uint16_t((command_sequence_[3] << 8) | command_sequence_[4])
			);
		break;

		case 0x0a:
			if(command_sequence_.size() != 3) return;
			set_mouse_keycode_reporting(command_sequence_[1], command_sequence_[2]);
		break;

		case 0x0b:
			if(command_sequence_.size() != 3) return;
			set_mouse_threshold(command_sequence_[1], command_sequence_[2]);
		break;

		case 0x0c:
			if(command_sequence_.size() != 3) return;
			set_mouse_scale(command_sequence_[1], command_sequence_[2]);
		break;

		case 0x0d:
			interrogate_mouse_position();
		break;

		case 0x0e:
			if(command_sequence_.size() != 6) return;
			/* command_sequence_[1] has no defined meaning. */
			set_mouse_position(
				uint16_t((command_sequence_[2] << 8) | command_sequence_[3]),
				uint16_t((command_sequence_[4] << 8) | command_sequence_[5])
			);
		break;

		case 0x0f:	set_mouse_y_upward();		break;
		case 0x10:	set_mouse_y_downward();		break;
		case 0x11:	resume();					break;
		case 0x12:	disable_mouse();			break;
		case 0x13:	pause();					break;

		/* Joystick commands. */
		case 0x14:	set_joystick_event_mode();					break;
		case 0x15:	set_joystick_interrogation_mode();			break;
		case 0x16:	interrogate_joysticks();					break;
		case 0x17:
			if(command_sequence_.size() != 2) return;
			set_joystick_monitoring_mode(command_sequence_[1]);
		break;
		case 0x18:	set_joystick_fire_button_monitoring_mode();	break;
		case 0x19: {
			if(command_sequence_.size() != 7) return;

			VelocityThreshold horizontal, vertical;
			horizontal.threshold = command_sequence_[1];
			horizontal.prior_rate = command_sequence_[3];
			horizontal.post_rate = command_sequence_[5];

			vertical.threshold = command_sequence_[2];
			vertical.prior_rate = command_sequence_[4];
			vertical.post_rate = command_sequence_[6];

			set_joystick_keycode_mode(horizontal, vertical);
		} break;
		case 0x1a:	disable_joysticks();						break;
	}

	// There was no premature exit, so a complete command sequence must have been satisfied.
	command_sequence_.clear();
}